

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  Var *this_00;
  ExprList *out_expr_list;
  Type *out_type;
  bool bVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> _Var5;
  Enum EVar6;
  Var *this_01;
  string_view name;
  string segment_name;
  Location loc;
  string initial_name;
  __uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_170;
  long *local_168;
  char *local_160;
  long local_158 [2];
  Location local_148;
  string local_128;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_108,this);
  local_148.field_1.field_1.offset = local_108.loc.field_1.field_1.offset;
  local_148.field_1._8_8_ = local_108.loc.field_1._8_8_;
  local_148.filename._M_len = local_108.loc.filename._M_len;
  local_148.filename._M_str = local_108.loc.filename._M_str;
  RVar3 = Expect(this,Elem);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  bVar1 = ParseBindVarOpt(this,&local_128);
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  if ((this->options_->features).bulk_memory_enabled_ == false) {
    std::__cxx11::string::_M_replace((ulong)&local_168,0,local_160,0x1a0369);
  }
  _Var5._M_head_impl = (ElemSegmentModuleField *)operator_new(0xe8);
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e1448;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.
  field_1.field_0.line = local_148.field_1.field_0.line;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.
  field_1.field_0.first_column = local_148.field_1.field_0.first_column;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.
  field_1.field_0.last_column = local_148.field_1.field_0.last_column;
  *(undefined4 *)
   ((long)&((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
           super_ModuleField.loc.field_1 + 0xc) = local_148.field_1._12_4_;
  *(undefined4 *)
   &((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.
    filename._M_len = (undefined4)local_148.filename._M_len;
  *(undefined4 *)
   ((long)&((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
           super_ModuleField.loc.filename._M_len + 4) = local_148.filename._M_len._4_4_;
  *(undefined4 *)
   &((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.
    filename._M_str = local_148.filename._M_str._0_4_;
  *(undefined4 *)
   ((long)&((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
           super_ModuleField.loc.filename._M_str + 4) = local_148.filename._M_str._4_4_;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.type_ =
       ElemSegment;
  ((_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__ElemSegmentModuleField_001e2fd0;
  ((_Var5._M_head_impl)->elem_segment).kind = Active;
  ((_Var5._M_head_impl)->elem_segment).name._M_dataplus._M_p =
       (pointer)&((_Var5._M_head_impl)->elem_segment).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&((_Var5._M_head_impl)->elem_segment).name,local_168,
             local_160 + (long)local_168);
  this_00 = &((_Var5._M_head_impl)->elem_segment).table_var;
  Var::Var(this_00);
  ((_Var5._M_head_impl)->elem_segment).elem_exprs.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var5._M_head_impl)->elem_segment).elem_exprs.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((_Var5._M_head_impl)->elem_segment).offset.size_ = 0;
  ((_Var5._M_head_impl)->elem_segment).elem_exprs.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var5._M_head_impl)->elem_segment).offset.first_ = (Expr *)0x0;
  ((_Var5._M_head_impl)->elem_segment).offset.last_ = (Expr *)0x0;
  if (((this->options_->features).reference_types_enabled_ == true) &&
     (bVar2 = Match(this,Declare), bVar2)) {
    ((_Var5._M_head_impl)->elem_segment).kind = Declared;
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    bVar1 = PeekMatchLpar(this,Table);
    if (!bVar1) {
      this_01 = &local_78;
LAB_0015c55b:
      Var::Var(this_01,0,&local_148);
      ParseVarOpt(this,this_00,this_01);
      goto LAB_0015c578;
    }
    RVar3 = Expect(this,Lpar);
    EVar6 = Error;
    if ((((RVar3.enum_ == Error) || (RVar3 = Expect(this,Table), RVar3.enum_ == Error)) ||
        (RVar3 = ParseVar(this,this_00), RVar3.enum_ == Error)) ||
       (RVar3 = Expect(this,Rpar), RVar3.enum_ == Error)) goto LAB_0015c677;
  }
  else {
    if (!bVar1) {
      this_01 = &local_c0;
      goto LAB_0015c55b;
    }
    this_01 = &local_108;
    name._M_str = local_128._M_dataplus._M_p;
    name._M_len = local_128._M_string_length;
    Var::Var(this_01,name,&local_148);
    Var::operator=(this_00,this_01);
LAB_0015c578:
    Var::~Var(this_01);
  }
  out_expr_list = &((_Var5._M_head_impl)->elem_segment).offset;
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    if ((((_Var5._M_head_impl)->elem_segment).kind != Declared) &&
       (bVar1 = ParseOffsetExprOpt(this,out_expr_list), !bVar1)) {
      ((_Var5._M_head_impl)->elem_segment).kind = Passive;
    }
  }
  else {
    RVar3 = ParseOffsetExpr(this,out_expr_list);
    EVar6 = Error;
    if (RVar3.enum_ == Error) goto LAB_0015c677;
  }
  out_type = &((_Var5._M_head_impl)->elem_segment).elem_type;
  bVar1 = ParseRefTypeOpt(this,out_type);
  if (bVar1) {
    ParseElemExprListOpt(this,&((_Var5._M_head_impl)->elem_segment).elem_exprs);
  }
  else {
    out_type->enum_ = FuncRef;
    out_type->type_index_ = 0;
    TVar4 = Peek(this,0);
    if (TVar4 == First_RefKind) {
      RVar3 = Expect(this,First_RefKind);
      EVar6 = Error;
      if (RVar3.enum_ == Error) goto LAB_0015c677;
    }
    ParseElemExprVarListOpt(this,&((_Var5._M_head_impl)->elem_segment).elem_exprs);
  }
  RVar3 = Expect(this,Rpar);
  EVar6 = Error;
  if (RVar3.enum_ != Error) {
    local_170._M_t.
    super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
    .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
         (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>)
         (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>)
         _Var5._M_head_impl;
    Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                *)&local_170);
    if ((_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
         )local_170._M_t.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl !=
        (ElemSegmentModuleField *)0x0) {
      (**(code **)(*(long *)local_170._M_t.
                            super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                            .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                            _M_head_impl + 8))();
    }
    local_170._M_t.
    super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
    .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
         (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>)
         (_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          )0x0;
    _Var5._M_head_impl = (ElemSegmentModuleField *)0x0;
    EVar6 = Ok;
  }
LAB_0015c677:
  if (_Var5._M_head_impl != (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)_Var5._M_head_impl + 8))(_Var5._M_head_impl);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = std::make_unique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  // Parse offset expression, if not declared/passive segment.
  if (options_->features.bulk_memory_enabled()) {
    if (field->elem_segment.kind != SegmentKind::Declared &&
        !ParseOffsetExprOpt(&field->elem_segment.offset)) {
      field->elem_segment.kind = SegmentKind::Passive;
    }
  } else {
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::FuncRef;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}